

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

AndConstraint * __thiscall icu_63::AndConstraint::add(AndConstraint *this,UErrorCode *status)

{
  UBool UVar1;
  AndConstraint *this_00;
  UErrorCode *size;
  AndConstraint *local_40;
  UErrorCode *status_local;
  AndConstraint *this_local;
  
  size = status;
  UVar1 = ::U_FAILURE(this->fInternalStatus);
  if (UVar1 == '\0') {
    this_00 = (AndConstraint *)UMemory::operator_new((UMemory *)0x38,(size_t)size);
    local_40 = (AndConstraint *)0x0;
    if (this_00 != (AndConstraint *)0x0) {
      memset(this_00,0,0x38);
      AndConstraint(this_00);
      local_40 = this_00;
    }
    this->next = local_40;
    if (this->next == (AndConstraint *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    this_local = this->next;
  }
  else {
    *status = this->fInternalStatus;
    this_local = (AndConstraint *)0x0;
  }
  return this_local;
}

Assistant:

AndConstraint*
AndConstraint::add(UErrorCode& status) {
    if (U_FAILURE(fInternalStatus)) {
        status = fInternalStatus;
        return nullptr;
    }
    this->next = new AndConstraint();
    if (this->next == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
    }
    return this->next;
}